

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::async_read_some_headers(http *this,handler *h)

{
  bool bVar1;
  callback *pcVar2;
  http *in_RDI;
  shared_ptr<cppcms::impl::cgi::http> ptr;
  shared_ptr<cppcms::impl::cgi::http> *in_stack_ffffffffffffff58;
  http *in_stack_ffffffffffffff60;
  http *in_stack_ffffffffffffff70;
  _func_int **in_stack_ffffffffffffff90;
  element_type *in_stack_ffffffffffffff98;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa0;
  
  bVar1 = input_buffer_empty(in_stack_ffffffffffffff70);
  if (bVar1) {
    pcVar2 = (callback *)&in_RDI->socket_;
    in_stack_ffffffffffffff60 = (http *)&stack0xffffffffffffff90;
    self(in_RDI);
    mfunc_to_event_handler<cppcms::impl::cgi::http,std::shared_ptr<cppcms::impl::cgi::http>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
              ((offset_in_http_to_subr)in_stack_ffffffffffffff90,
               (shared_ptr<cppcms::impl::cgi::http> *)0x0,
               (callback<void_(const_std::error_code_&)> *)0xe1);
    booster::callback<void(std::error_code_const&)>::
    callback<booster::callable<void(std::error_code_const&)>>
              ((callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffff60,
               (intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)pcVar2);
    booster::aio::basic_io_device::on_readable(pcVar2);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x49d569);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
               in_stack_ffffffffffffff60);
    std::shared_ptr<cppcms::impl::cgi::http>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::http> *)0x49d57d);
  }
  else {
    self(in_RDI);
    pcVar2 = (callback *)booster::aio::basic_io_device::get_io_service();
    std::shared_ptr<cppcms::impl::cgi::http>::shared_ptr
              ((shared_ptr<cppcms::impl::cgi::http> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    booster::callback<void_(const_std::error_code_&)>::callback
              ((callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffff60,
               (callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffff58);
    booster::callback<void()>::
    callback<cppcms::impl::cgi::http::async_read_some_headers(booster::callback<void(std::error_code_const&)>const&)::_lambda()_1_>
              ((callback<void_()> *)in_stack_ffffffffffffffa0._M_pi,
               (anon_class_24_2_de3467ba_for_func *)in_stack_ffffffffffffff98);
    booster::aio::io_service::post(pcVar2);
    booster::callback<void_()>::~callback((callback<void_()> *)0x49d452);
    async_read_some_headers(booster::callback<void(std::error_code_const&)>const&)::{lambda()#1}::
    ~callback((anon_class_24_2_de3467ba_for_func *)in_stack_ffffffffffffff60);
    std::shared_ptr<cppcms::impl::cgi::http>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::http> *)0x49d469);
  }
  update_time(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void async_read_some_headers(handler const &h)
		{
			if(!input_buffer_empty()) {
				auto ptr = self();
				socket_.get_io_service().post([=] {
					ptr->some_headers_data_read(booster::system::error_code(),h);
				});
			}
			else {
				socket_.on_readable(mfunc_to_event_handler(&http::some_headers_data_read,self(),h));
			}
			update_time();
		}